

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QItemViewPaintPairs * __thiscall
QAbstractItemViewPrivate::draggablePaintPairs
          (QItemViewPaintPairs *__return_storage_ptr__,QAbstractItemViewPrivate *this,
          QModelIndexList *indexes,QRect *r)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  int extraout_EDX;
  long lVar4;
  QModelIndex *index;
  QModelIndex *pQVar5;
  long in_FS_OFFSET;
  QItemViewPaintPair local_88;
  undefined1 local_58 [16];
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  local_48 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QItemViewPaintPair *)0x0;
  pQVar5 = (indexes->d).ptr;
  for (lVar4 = (indexes->d).size * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (**(code **)(*plVar1 + 0x1e0))(plVar1,pQVar5);
    cVar2 = QRect::intersects((QRect *)local_58);
    if (cVar2 != '\0') {
      local_88.index.m.ptr = (pQVar5->m).ptr;
      local_88.index.r = pQVar5->r;
      local_88.index.c = pQVar5->c;
      local_88.index.i = pQVar5->i;
      local_88.rect = (QRect)local_58;
      QList<QItemViewPaintPair>::emplaceBack<QItemViewPaintPair>(__return_storage_ptr__,&local_88);
      QRect::operator|=(r,(QRect *)local_58);
    }
    pQVar5 = pQVar5 + 1;
  }
  iVar3 = QRect::operator&(r,&local_48);
  (r->x1).m_i = iVar3;
  (r->x2).m_i = extraout_EDX;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QItemViewPaintPairs QAbstractItemViewPrivate::draggablePaintPairs(const QModelIndexList &indexes, QRect *r) const
{
    Q_ASSERT(r);
    Q_Q(const QAbstractItemView);
    QRect &rect = *r;
    const QRect viewportRect = viewport->rect();
    QItemViewPaintPairs ret;
    for (const auto &index : indexes) {
        const QRect current = q->visualRect(index);
        if (current.intersects(viewportRect)) {
            ret.append({current, index});
            rect |= current;
        }
    }
    QRect clipped = rect & viewportRect;
    rect.setLeft(clipped.left());
    rect.setRight(clipped.right());
    return ret;
}